

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URI.cpp
# Opt level: O3

bool __thiscall stick::URI::isEmpty(URI *this)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = false;
  bVar2 = false;
  if (((((this->m_scheme).m_length == 0) && (bVar2 = bVar1, (this->m_host).m_length == 0)) &&
      ((this->m_path).m_length == 0)) && ((this->m_query).m_length == 0)) {
    bVar2 = (this->m_fragment).m_length == 0;
  }
  return bVar2;
}

Assistant:

bool URI::isEmpty() const
{
    return m_scheme.isEmpty() && m_host.isEmpty() && m_path.isEmpty() && m_query.isEmpty() &&
           m_fragment.isEmpty();
}